

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

bool __thiscall IR::Opnd::IsNotNumber(Opnd *this)

{
  bool bVar1;
  bool bVar2;
  RegOpnd *regOpnd;
  ValueType local_12;
  
  bVar1 = ValueType::IsNotNumber(&local_12);
  bVar2 = true;
  if (!bVar1) {
    if (this->m_kind == OpndKindReg) {
      if (this[1]._vptr_Opnd != (_func_int **)0x0) {
        bVar2 = (bool)((*(byte *)(this[1]._vptr_Opnd + 3) & 2) >> 1);
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool
Opnd::IsNotNumber() const
{
    if (this->GetValueType().IsNotNumber())
    {
        return true;
    }
    if (this->IsRegOpnd())
    {
        const IR::RegOpnd* regOpnd = this->AsRegOpnd();

        if (regOpnd->m_sym == nullptr)
        {
            return true;
        }

        return regOpnd->m_sym->m_isNotNumber;
    }
    return false;
}